

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JoinerSession::SendRlyTx
          (Error *__return_storage_ptr__,JoinerSession *this,ByteArray *aDtlsMessage,
          bool aIncludeKek)

{
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  Error *pEVar4;
  char *pcVar5;
  char *pcVar6;
  ByteArray *aBytes;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  allocator local_1e1;
  undefined1 local_1e0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  _Alloc_hider _Stack_190;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  *local_188;
  char *apcStack_180 [2];
  size_type sStack_170;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  *local_168;
  code *local_160;
  parse_func p_Stack_158;
  code *local_150;
  code *pcStack_148;
  code *local_140;
  writer write;
  size_type sStack_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  string local_f8;
  _Any_data local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Request rlyTx;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&rlyTx,kNonConfirmable,kPost);
  std::__cxx11::string::string((string *)local_1e0,"/c/tx",(allocator *)&local_1b8);
  coap::Message::SetUriPath((Error *)local_198,&rlyTx,(string *)local_1e0);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_190);
  std::__cxx11::string::~string((string *)local_1e0);
  if (EVar2 != kNone) goto LAB_001b57fb;
  tlv::Tlv::Tlv((Tlv *)local_1e0,kJoinerUdpPort,this->mJoinerUdpPort,kMeshCoP);
  AppendTlv((Error *)local_198,&rlyTx,(Tlv *)local_1e0);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_190);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
  if (EVar2 != kNone) goto LAB_001b57fb;
  tlv::Tlv::Tlv((Tlv *)local_1e0,kJoinerRouterLocator,this->mJoinerRouterLocator,kMeshCoP);
  AppendTlv((Error *)local_198,&rlyTx,(Tlv *)local_1e0);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_190);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
  if (EVar2 != kNone) goto LAB_001b57fb;
  GetJoinerIid((ByteArray *)&local_1b8,this);
  tlv::Tlv::Tlv((Tlv *)local_1e0,kJoinerIID,(ByteArray *)&local_1b8,kMeshCoP);
  AppendTlv((Error *)local_198,&rlyTx,(Tlv *)local_1e0);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_190);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8);
  if (EVar2 != kNone) goto LAB_001b57fb;
  tlv::Tlv::Tlv((Tlv *)local_1e0,kJoinerDtlsEncapsulation,aDtlsMessage,kMeshCoP);
  AppendTlv((Error *)local_198,&rlyTx,(Tlv *)local_1e0);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_190);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
  if (EVar2 != kNone) goto LAB_001b57fb;
  if (aIncludeKek) {
    peVar3 = (this->mDtlsSession).
             super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (peVar3->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1e0,kJoinerRouterKEK,&peVar3->mKek,kMeshCoP);
      AppendTlv((Error *)local_198,&rlyTx,(Tlv *)local_1e0);
      pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_198);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&_Stack_190);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
      if (EVar2 != kNone) goto LAB_001b57fb;
      goto LAB_001b553c;
    }
    local_198 = (undefined1  [8])((ulong)local_198 & 0xffffffff00000000);
    _Stack_190._M_p = "DTLS KEK is not available";
    local_188 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
                 *)0x19;
    apcStack_180[0] = (char *)0x0;
    sStack_170 = 0;
    pcVar5 = "DTLS KEK is not available";
    apcStack_180[1] = (char *)local_198;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_198);
      }
    }
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1b8,(v10 *)"DTLS KEK is not available",(string_view)ZEXT816(0x19),args_00);
    local_1e0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_1d8,(string *)&local_1b8);
    Error::operator=(__return_storage_ptr__,(Error *)local_1e0);
    std::__cxx11::string::~string((string *)&local_1d8);
    this_00 = &local_1b8;
  }
  else {
LAB_001b553c:
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    coap::CoapSecure::SendRequest(&this->mCommImpl->mBrClient,&rlyTx,(ResponseHandler *)&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    std::__cxx11::string::string((string *)local_1e0,"joiner-session",&local_1e1);
    local_198 = (undefined1  [8])0xd0000000e;
    _Stack_190._M_p = (char *)0x40000000d;
    local_188 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
                 *)CONCAT44(local_188._4_4_,7);
    apcStack_180[0] =
         "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}";
    apcStack_180[1] = (char *)0x54;
    sStack_170 = 0x500000000;
    local_160 = ::fmt::v10::detail::
                parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    p_Stack_158 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_150 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcStack_148 = ::fmt::v10::detail::
                  parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_140 = ::fmt::v10::detail::
                parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
    pcVar5 = "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}";
    local_168 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
                 *)local_198;
    write.handler_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
          *)local_198;
    while (pcVar5 != "") {
      cVar1 = *pcVar5;
      pcVar6 = pcVar5;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>_>
          ::writer::operator()(&write,pcVar5,"");
          goto LAB_001b5667;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>_>
      ::writer::operator()(&write,pcVar5,pcVar6);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,std::__cxx11::string,unsigned_long,bool>&>
                         (pcVar6,"",
                          (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
                           *)local_198);
    }
LAB_001b5667:
    DtlsSession::GetStateString_abi_cxx11_
              ((string *)&write,
               (this->mDtlsSession).
               super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110,&this->mJoinerId)
    ;
    utils::Hex_abi_cxx11_(&local_f8,(utils *)&local_110,aBytes);
    local_168 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
                 *)((aDtlsMessage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    )._M_impl.super__Vector_impl_data._M_finish +
                   -(long)(aDtlsMessage->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start);
    p_Stack_158 = (parse_func)(ulong)aIncludeKek;
    local_188 = write.handler_;
    apcStack_180[0] = (char *)sStack_128;
    apcStack_180[1] = local_f8._M_dataplus._M_p;
    sStack_170 = local_f8._M_string_length;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_198;
    fmt.size_ = 0x74dde;
    fmt.data_ = (char *)0x54;
    local_198 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1b8,
               (v10 *)
               "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}"
               ,fmt,args);
    Log(kDebug,(string *)local_1e0,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_110);
    std::__cxx11::string::~string((string *)&write);
    this_00 = (string *)local_1e0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001b57fb:
  coap::Message::~Message(&rlyTx);
  return __return_storage_ptr__;
}

Assistant:

Error JoinerSession::SendRlyTx(const ByteArray &aDtlsMessage, bool aIncludeKek)
{
    Error         error;
    coap::Request rlyTx{coap::Type::kNonConfirmable, coap::Code::kPost};

    SuccessOrExit(error = rlyTx.SetUriPath(uri::kRelayTx));

    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerUdpPort, GetJoinerUdpPort()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterLocator, GetJoinerRouterLocator()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerIID, GetJoinerIid()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerDtlsEncapsulation, aDtlsMessage}));

    if (aIncludeKek)
    {
        VerifyOrExit(!mDtlsSession->GetKek().empty(), error = ERROR_INVALID_STATE("DTLS KEK is not available"));
        SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterKEK, mDtlsSession->GetKek()}));
    }

    mCommImpl.mBrClient.SendRequest(rlyTx, nullptr);

    LOG_DEBUG(LOG_REGION_JOINER_SESSION,
              "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}",
              static_cast<void *>(this), mDtlsSession->GetStateString(), utils::Hex(GetJoinerId()), aDtlsMessage.size(),
              aIncludeKek);

exit:
    return error;
}